

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve.c
# Opt level: O1

void av1_highbd_convolve_x_sr_c
               (uint16_t *src,int src_stride,uint16_t *dst,int dst_stride,int w,int h,
               InterpFilterParams *filter_params_x,int subpel_x_qn,ConvolveParams *conv_params,
               int bd)

{
  ushort uVar1;
  int16_t *piVar2;
  byte bVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  int local_68;
  ulong local_60;
  
  if (0 < h) {
    uVar1 = filter_params_x->taps;
    piVar2 = filter_params_x->filter_ptr;
    bVar3 = (byte)conv_params->round_0;
    local_68 = 1 - (uint)(uVar1 >> 1);
    local_60 = 0;
    do {
      if (0 < w) {
        uVar7 = 0;
        iVar6 = local_68;
        do {
          if ((ulong)filter_params_x->taps == 0) {
            iVar8 = 0;
          }
          else {
            uVar5 = 0;
            iVar8 = 0;
            do {
              iVar8 = iVar8 + (uint)src[(long)iVar6 + uVar5] *
                              (int)*(short *)((long)piVar2 +
                                             uVar5 * 2 +
                                             (ulong)((subpel_x_qn & 0xfU) * (uint)uVar1 * 2));
              uVar5 = uVar5 + 1;
            } while (filter_params_x->taps != uVar5);
          }
          iVar8 = (iVar8 + ((1 << (bVar3 & 0x1f)) >> 1) >> (bVar3 & 0x1f)) +
                  ((1 << (7 - bVar3 & 0x1f)) >> 1) >> (7 - bVar3 & 0x1f);
          if (bd == 10) {
            iVar4 = 0x3ff;
          }
          else if (bd == 0xc) {
            iVar4 = 0xfff;
          }
          else {
            iVar4 = 0xff;
          }
          if (iVar4 <= iVar8) {
            iVar8 = iVar4;
          }
          if (iVar8 < 1) {
            iVar8 = 0;
          }
          dst[local_60 * (long)dst_stride + uVar7] = (uint16_t)iVar8;
          uVar7 = uVar7 + 1;
          iVar6 = iVar6 + 1;
        } while (uVar7 != (uint)w);
      }
      local_60 = local_60 + 1;
      local_68 = local_68 + src_stride;
    } while (local_60 != (uint)h);
  }
  return;
}

Assistant:

void av1_highbd_convolve_x_sr_c(const uint16_t *src, int src_stride,
                                uint16_t *dst, int dst_stride, int w, int h,
                                const InterpFilterParams *filter_params_x,
                                const int subpel_x_qn,
                                ConvolveParams *conv_params, int bd) {
  const int fo_horiz = filter_params_x->taps / 2 - 1;
  const int bits = FILTER_BITS - conv_params->round_0;

  assert(bits >= 0);
  assert((FILTER_BITS - conv_params->round_1) >= 0 ||
         ((conv_params->round_0 + conv_params->round_1) == 2 * FILTER_BITS));

  // horizontal filter
  const int16_t *x_filter = av1_get_interp_filter_subpel_kernel(
      filter_params_x, subpel_x_qn & SUBPEL_MASK);
  for (int y = 0; y < h; ++y) {
    for (int x = 0; x < w; ++x) {
      int32_t res = 0;
      for (int k = 0; k < filter_params_x->taps; ++k) {
        res += x_filter[k] * src[y * src_stride + x - fo_horiz + k];
      }
      res = ROUND_POWER_OF_TWO(res, conv_params->round_0);
      dst[y * dst_stride + x] =
          clip_pixel_highbd(ROUND_POWER_OF_TWO(res, bits), bd);
    }
  }
}